

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo.cpp
# Opt level: O3

void __thiscall
DSBarInfo::DrawString
          (DSBarInfo *this,FFont *font,char *cstring,SBarInfoCoordinate x,SBarInfoCoordinate y,
          int xOffset,int yOffset,double Alpha,bool fullScreenOffsets,EColorRange translation,
          int spacing,bool drawshadow,int shadowX,int shadowY)

{
  undefined4 uVar1;
  undefined4 uVar2;
  byte bVar3;
  bool bVar4;
  double dVar5;
  byte bVar6;
  EColorRange range;
  int iVar7;
  FRemapTable *pFVar8;
  FTexture *pFVar9;
  SBarInfo *pSVar10;
  EColorRange EVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  double rx;
  double ry;
  BYTE *str;
  double rw;
  double local_b0;
  double rh;
  int local_9c;
  double local_98;
  double local_90;
  FTexture *local_88;
  double local_80;
  double local_78;
  double local_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined4 extraout_var;
  
  local_b0 = (double)CONCAT44(local_b0._4_4_,xOffset);
  local_98 = (double)CONCAT44(local_98._4_4_,y);
  EVar11 = translation;
  if (translation == CR_BRICK) {
    EVar11 = NumTextColors;
  }
  dVar12 = (double)((int)x + spacing * 2 >> 1);
  local_90 = (double)((int)y >> 1);
  str = (BYTE *)cstring;
  local_80 = Alpha;
  pFVar8 = FFont::GetColorTranslation(font,translation);
  if (fullScreenOffsets) {
    if (hud_scale.Value == true) {
      uVar1 = this->script->cleanX;
      uVar2 = this->script->cleanY;
      dVar13 = (double)(int)uVar1;
      dVar14 = (double)(int)uVar2;
    }
    else {
      dVar13 = 1.0;
      dVar14 = 1.0;
    }
    if (((uint)x & 1) != 0) {
      if (hud_scale.Value == false) {
        dVar5 = 2.0;
      }
      else {
        dVar5 = dVar13 + dVar13;
      }
      dVar12 = dVar12 + (double)(screen->super_DSimpleCanvas).super_DCanvas.Width / dVar5;
    }
    if (((ulong)local_98 & 1) != 0) {
      if (hud_scale.Value == false) {
        dVar5 = 2.0;
      }
      else {
        dVar5 = dVar14 + dVar14;
      }
      local_90 = local_90 + (double)(screen->super_DSimpleCanvas).super_DCanvas.Height / dVar5;
    }
  }
  else {
    dVar13 = 1.0;
    dVar14 = 1.0;
  }
  local_b0 = (double)local_b0._0_4_;
  local_98 = (double)yOffset + local_90;
  local_70 = local_80 * 0.40625;
  local_78 = (double)shadowX * dVar13;
  uVar15 = SUB84(dVar14,0);
  uVar16 = (undefined4)((ulong)dVar14 >> 0x20);
  local_58._8_4_ = uVar15;
  local_58._0_8_ = dVar13;
  local_58._12_4_ = uVar16;
  local_68._8_4_ = uVar15;
  local_68._0_8_ = dVar14;
  local_68._12_4_ = uVar16;
  local_48._8_4_ = uVar15;
  local_48._0_8_ = dVar14 * (double)shadowY;
  local_48._12_4_ = uVar16;
  do {
    while( true ) {
      while (bVar6 = *cstring, bVar6 == 0x1c) {
        str = (byte *)cstring + 1;
        range = V_ParseFontColor(&str,translation,EVar11 + CR_UNDEFINED);
        cstring = (char *)str;
        if (range != CR_UNDEFINED) {
          pFVar8 = FFont::GetColorTranslation(font,range);
          cstring = (char *)str;
        }
      }
      if (bVar6 == 0) {
        return;
      }
      if (bVar6 != 0x20) break;
      if (this->script->spacingCharacter == '\0') {
        iVar7 = font->SpaceWidth;
        str = (BYTE *)cstring;
      }
      else {
        iVar7 = (*font->_vptr_FFont[3])(font);
      }
      dVar12 = dVar12 + (double)iVar7;
LAB_004c3789:
      cstring = (char *)(str + 1);
      str = (BYTE *)cstring;
    }
    bVar3 = this->script->spacingCharacter;
    if (bVar3 != 0) {
      bVar6 = bVar3;
    }
    local_9c = (*font->_vptr_FFont[3])(font,(ulong)bVar6);
    iVar7 = (*font->_vptr_FFont[2])(font,(ulong)*str,&local_9c);
    pFVar9 = (FTexture *)CONCAT44(extraout_var,iVar7);
    if (pFVar9 != (FTexture *)0x0) {
      pSVar10 = this->script;
      if (pSVar10->spacingCharacter == '\0') {
        dVar12 = dVar12 + (double)(pFVar9->LeftOffset + 1);
      }
      rx = dVar12 + local_b0;
      ry = local_98;
      rw = (double)pFVar9->Width / (pFVar9->Scale).X;
      rh = (double)pFVar9->Height / (pFVar9->Scale).Y;
      if (pSVar10->spacingCharacter != '\0') {
        iVar7 = (*font->_vptr_FFont[3])(font);
        pSVar10 = this->script;
        if (pSVar10->spacingAlignment == ALIGN_RIGHT) {
          dVar13 = (double)iVar7 - rw;
        }
        else {
          if (pSVar10->spacingAlignment != ALIGN_CENTER) goto LAB_004c34cc;
          dVar13 = (double)iVar7 * 0.5 - rw * 0.5;
        }
        rx = dVar13 + rx;
      }
LAB_004c34cc:
      dVar13 = rx;
      local_88 = pFVar9;
      if (fullScreenOffsets) {
        if (((vid_fps.Value == true) && (dVar12 < 0.0)) && (0.0 <= local_90)) {
          ry = ry + 10.0;
        }
        dVar14 = ry;
        if (hud_scale.Value == true) {
          rx = (double)local_58._0_8_ * rx;
          ry = (double)local_68._0_8_ * ry;
          rw = rw * (double)local_58._0_8_;
          rh = rh * (double)local_68._0_8_;
        }
        if (dVar13 < 0.0) {
          rx = rx + (double)(screen->super_DSimpleCanvas).super_DCanvas.Width;
        }
        if (dVar14 < 0.0) {
          iVar7 = (screen->super_DSimpleCanvas).super_DCanvas.Height;
LAB_004c3675:
          ry = ry + (double)iVar7;
        }
      }
      else {
        rx = (double)*(int *)&(this->super_DBaseStatusBar).super_DObject.field_0x24 + rx;
        bVar4 = (this->super_DBaseStatusBar).Scaled;
        iVar7 = 200;
        if (bVar4 == true) {
          iVar7 = pSVar10->resH;
        }
        ry = (double)(((this->super_DBaseStatusBar).ST_Y - iVar7) + pSVar10->height) + ry;
        if (bVar4 == false) {
          iVar7 = 200 - pSVar10->resH;
          goto LAB_004c3675;
        }
        DCanvas::VirtualToRealCoords
                  ((DCanvas *)screen,&rx,&ry,&rw,&rh,(double)pSVar10->resW,(double)pSVar10->resH,
                   true,true);
      }
      if (drawshadow) {
        DCanvas::DrawTexture
                  ((DCanvas *)screen,local_88,rx + local_78,ry + (double)local_48._0_8_,0x400013af,
                   rw,rh,local_70,0x400013b0,0x4000138c,0x4000138d,0,0);
      }
      pFVar9 = local_88;
      DCanvas::DrawTexture
                ((DCanvas *)screen,local_88,rx,ry,0x400013af,rw,rh,0x400013b0,0x4000138e,pFVar8,
                 0x4000138c,0);
      if (this->script->spacingCharacter == '\0') {
        iVar7 = ~(int)pFVar9->LeftOffset + local_9c + spacing;
      }
      else {
        iVar7 = (*font->_vptr_FFont[3])(font);
        iVar7 = iVar7 + spacing;
      }
      dVar12 = dVar12 + (double)iVar7;
      goto LAB_004c3789;
    }
    cstring = (char *)(str + 1);
    str = (BYTE *)cstring;
  } while( true );
}

Assistant:

void DrawString(FFont *font, const char* cstring, SBarInfoCoordinate x, SBarInfoCoordinate y, int xOffset, int yOffset, double Alpha, bool fullScreenOffsets, EColorRange translation, int spacing=0, bool drawshadow=false, int shadowX=2, int shadowY=2) const
	{
		x += spacing;
		double ax = *x;
		double ay = *y;

		double xScale = 1.0;
		double yScale = 1.0;

		const BYTE* str = (const BYTE*) cstring;
		const EColorRange boldTranslation = EColorRange(translation ? translation - 1 : NumTextColors - 1);
		FRemapTable *remap = font->GetColorTranslation(translation);

		if(fullScreenOffsets)
		{
			if(hud_scale)
			{
				xScale = script->cleanX;
				yScale = script->cleanY;
			}
			adjustRelCenter(x.RelCenter(), y.RelCenter(), *x, *y, ax, ay, xScale, yScale);
		}
		while(*str != '\0')
		{
			if(*str == ' ')
			{
				if(script->spacingCharacter == '\0')
					ax += font->GetSpaceWidth();
				else
					ax += font->GetCharWidth((unsigned char) script->spacingCharacter);
				str++;
				continue;
			}
			else if(*str == TEXTCOLOR_ESCAPE)
			{
				EColorRange newColor = V_ParseFontColor(++str, translation, boldTranslation);
				if(newColor != CR_UNDEFINED)
					remap = font->GetColorTranslation(newColor);
				continue;
			}

			int width;
			if(script->spacingCharacter == '\0') //No monospace?
				width = font->GetCharWidth((unsigned char) *str);
			else
				width = font->GetCharWidth((unsigned char) script->spacingCharacter);
			FTexture* character = font->GetChar((unsigned char) *str, &width);
			if(character == NULL) //missing character.
			{
				str++;
				continue;
			}
			if(script->spacingCharacter == '\0') //If we are monospaced lets use the offset
				ax += (character->LeftOffset+1); //ignore x offsets since we adapt to character size

			double rx, ry, rw, rh;
			rx = ax + xOffset;
			ry = ay + yOffset;
			rw = character->GetScaledWidthDouble();
			rh = character->GetScaledHeightDouble();

			if(script->spacingCharacter != '\0')
			{
				double spacingSize = font->GetCharWidth((unsigned char) script->spacingCharacter);
				switch(script->spacingAlignment)
				{
					default:
						break;
					case SBarInfo::ALIGN_CENTER:
						rx += (spacingSize/2)-(rw/2);
						break;
					case SBarInfo::ALIGN_RIGHT:
						rx += spacingSize-rw;
						break;
				}
			}

			if(!fullScreenOffsets)
			{
				rx += ST_X;
				ry += ST_Y - (Scaled ? script->resH : 200) + script->height;
				if(Scaled)
					screen->VirtualToRealCoords(rx, ry, rw, rh, script->resW, script->resH, true);
				else
				{
					ry += (200 - script->resH);
				}
			}
			else
			{
				if(vid_fps && ax < 0 && ay >= 0)
					ry += 10;

				bool xright = rx < 0;
				bool ybot = ry < 0;

				if(hud_scale)
				{
					rx *= xScale;
					ry *= yScale;
					rw *= xScale;
					rh *= yScale;
				}
				if(xright)
					rx = SCREENWIDTH + rx;
				if(ybot)
					ry = SCREENHEIGHT + ry;
			}
			if(drawshadow)
			{
				double salpha = (Alpha *HR_SHADOW);
				double srx = rx + (shadowX*xScale);
				double sry = ry + (shadowY*yScale);
				screen->DrawTexture(character, srx, sry,
					DTA_DestWidthF, rw,
					DTA_DestHeightF, rh,
					DTA_AlphaF, salpha,
					DTA_FillColor, 0,
					TAG_DONE);
			}
			screen->DrawTexture(character, rx, ry,
				DTA_DestWidthF, rw,
				DTA_DestHeightF, rh,
				DTA_Translation, remap,
				DTA_AlphaF, Alpha,
				TAG_DONE);
			if(script->spacingCharacter == '\0')
				ax += width + spacing - (character->LeftOffset+1);
			else //width gets changed at the call to GetChar()
				ax += font->GetCharWidth((unsigned char) script->spacingCharacter) + spacing;
			str++;
		}
	}